

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaCompareDecimals(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_long uVar3;
  xmlSchemaValPtr pxVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  int iVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  
  uVar1 = *(ushort *)((long)&x->value + 0x1c);
  if (((uVar1 & 1) == 0) ||
     ((((x->value).decimal.lo == 0 && ((x->value).decimal.mi == 0)) && ((x->value).decimal.hi == 0))
     )) {
    iVar5 = 1;
    if ((*(byte *)((long)&y->value + 0x1c) & 1) != 0) {
      if ((y->value).decimal.lo != 0) {
        return 1;
      }
      if ((y->value).decimal.mi != 0) {
        return 1;
      }
      if ((y->value).decimal.hi != 0) {
        return 1;
      }
    }
  }
  else {
    iVar5 = -1;
    if ((*(byte *)((long)&y->value + 0x1c) & 1) == 0) {
      return -1;
    }
    if ((((y->value).decimal.lo == 0) && ((y->value).decimal.mi == 0)) &&
       ((y->value).decimal.hi == 0)) {
      return -1;
    }
  }
  iVar6 = (uint)(uVar1 >> 8) - (uVar1 >> 1 & 0x7f);
  uVar2 = *(ushort *)((long)&y->value + 0x1c);
  iVar9 = (uint)(uVar2 >> 8) - (uVar2 >> 1 & 0x7f);
  if ((iVar6 == 1) && ((x->value).decimal.lo == 0)) {
    if (iVar9 == 1) {
      iVar5 = -iVar5;
      uVar3 = (y->value).decimal.lo;
LAB_001d0e85:
      if (uVar3 != 0) {
        return iVar5;
      }
      return 0;
    }
  }
  else {
    if ((iVar9 == 1) && ((y->value).decimal.lo == 0)) {
      if (iVar6 != 1) {
        return iVar5;
      }
      uVar3 = (x->value).decimal.lo;
      goto LAB_001d0e85;
    }
    if (iVar9 < iVar6) {
      return iVar5;
    }
    if (iVar9 <= iVar6) {
      iVar6 = (uint)(uVar1 >> 8) - (uint)(uVar2 >> 8);
      pxVar4 = x;
      if (iVar6 < 0) {
        iVar6 = -iVar6;
        iVar5 = -iVar5;
        pxVar4 = y;
        y = x;
      }
      pxVar12 = (xmlChar *)(pxVar4->value).decimal.hi;
      pxVar7 = (pxVar4->value).qname.name;
      pxVar11 = (pxVar4->value).qname.uri;
      iVar6 = iVar6 + 9;
      do {
        iVar9 = iVar6;
        pxVar8 = pxVar11;
        pxVar10 = pxVar7;
        pxVar11 = pxVar12;
        iVar6 = iVar9 + -8;
        pxVar12 = (xmlChar *)0x0;
        pxVar7 = pxVar8;
      } while (8 < iVar9 + -9);
      pxVar12 = pxVar11;
      if (0 < iVar9 + -9) {
        do {
          pxVar12 = (xmlChar *)((ulong)pxVar11 / 10);
          pxVar7 = pxVar8 + ((ulong)pxVar8 / 5 & 0xfffffffffffffffe) * -5;
          pxVar8 = (xmlChar *)((ulong)(pxVar8 + ((ulong)pxVar11 % 10) * 100000000) / 10);
          pxVar10 = (xmlChar *)((ulong)(pxVar10 + (long)pxVar7 * 100000000) / 10);
          iVar6 = iVar6 + -1;
          pxVar11 = pxVar12;
        } while (1 < iVar6);
      }
      pxVar7 = (xmlChar *)(y->value).decimal.hi;
      if (pxVar7 < pxVar12) {
        return iVar5;
      }
      if (pxVar12 == pxVar7) {
        pxVar12 = (xmlChar *)(y->value).decimal.mi;
        if (pxVar12 < pxVar8) {
          return iVar5;
        }
        if (pxVar8 == pxVar12) {
          pxVar12 = (xmlChar *)(y->value).decimal.lo;
          if (pxVar12 < pxVar10) {
            return iVar5;
          }
          if (pxVar10 == pxVar12) {
            if (0xff < (uVar2 ^ uVar1)) {
              return iVar5;
            }
            return 0;
          }
        }
      }
    }
  }
  return -iVar5;
}

Assistant:

static int
xmlSchemaCompareDecimals(xmlSchemaValPtr x, xmlSchemaValPtr y)
{
    xmlSchemaValPtr swp;
    int order = 1, integx, integy, dlen;
    unsigned long hi, mi, lo;

    /*
     * First test: If x is -ve and not zero
     */
    if ((x->value.decimal.sign) &&
	((x->value.decimal.lo != 0) ||
	 (x->value.decimal.mi != 0) ||
	 (x->value.decimal.hi != 0))) {
	/*
	 * Then if y is -ve and not zero reverse the compare
	 */
	if ((y->value.decimal.sign) &&
	    ((y->value.decimal.lo != 0) ||
	     (y->value.decimal.mi != 0) ||
	     (y->value.decimal.hi != 0)))
	    order = -1;
	/*
	 * Otherwise (y >= 0) we have the answer
	 */
	else
	    return (-1);
    /*
     * If x is not -ve and y is -ve we have the answer
     */
    } else if ((y->value.decimal.sign) &&
	       ((y->value.decimal.lo != 0) ||
		(y->value.decimal.mi != 0) ||
		(y->value.decimal.hi != 0))) {
        return (1);
    }
    /*
     * If it's not simply determined by a difference in sign,
     * then we need to compare the actual values of the two nums.
     * To do this, we start by looking at the integral parts.
     * If the number of integral digits differ, then we have our
     * answer.
     */
    integx = x->value.decimal.total - x->value.decimal.frac;
    integy = y->value.decimal.total - y->value.decimal.frac;
    /*
    * NOTE: We changed the "total" for values like "0.1"
    *   (or "-0.1" or ".1") to be 1, which was 2 previously.
    *   Therefore the special case, when such values are
    *   compared with 0, needs to be handled separately;
    *   otherwise a zero would be recognized incorrectly as
    *   greater than those values. This has the nice side effect
    *   that we gain an overall optimized comparison with zeroes.
    * Note that a "0" has a "total" of 1 already.
    */
    if (integx == 1) {
	if (x->value.decimal.lo == 0) {
	    if (integy != 1)
		return -order;
	    else if (y->value.decimal.lo != 0)
		return -order;
	    else
		return(0);
	}
    }
    if (integy == 1) {
	if (y->value.decimal.lo == 0) {
	    if (integx != 1)
		return order;
	    else if (x->value.decimal.lo != 0)
		return order;
	    else
		return(0);
	}
    }

    if (integx > integy)
	return order;
    else if (integy > integx)
	return -order;

    /*
     * If the number of integral digits is the same for both numbers,
     * then things get a little more complicated.  We need to "normalize"
     * the numbers in order to properly compare them.  To do this, we
     * look at the total length of each number (length => number of
     * significant digits), and divide the "shorter" by 10 (decreasing
     * the length) until they are of equal length.
     */
    dlen = x->value.decimal.total - y->value.decimal.total;
    if (dlen < 0) {	/* y has more digits than x */
	swp = x;
	hi = y->value.decimal.hi;
	mi = y->value.decimal.mi;
	lo = y->value.decimal.lo;
	dlen = -dlen;
	order = -order;
    } else {		/* x has more digits than y */
	swp = y;
	hi = x->value.decimal.hi;
	mi = x->value.decimal.mi;
	lo = x->value.decimal.lo;
    }
    while (dlen > 8) {	/* in effect, right shift by 10**8 */
	lo = mi;
	mi = hi;
	hi = 0;
	dlen -= 8;
    }
    while (dlen > 0) {
	unsigned long rem1, rem2;
	rem1 = (hi % 10) * 100000000L;
	hi = hi / 10;
	rem2 = (mi % 10) * 100000000L;
	mi = (mi + rem1) / 10;
	lo = (lo + rem2) / 10;
	dlen--;
    }
    if (hi > swp->value.decimal.hi) {
	return order;
    } else if (hi == swp->value.decimal.hi) {
	if (mi > swp->value.decimal.mi) {
	    return order;
	} else if (mi == swp->value.decimal.mi) {
	    if (lo > swp->value.decimal.lo) {
		return order;
	    } else if (lo == swp->value.decimal.lo) {
		if (x->value.decimal.total == y->value.decimal.total) {
		    return 0;
		} else {
		    return order;
		}
	    }
	}
    }
    return -order;
}